

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vitals.c
# Opt level: O2

int mmk_streq(char *src,char *ref)

{
  char cVar1;
  char cVar2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    cVar1 = src[lVar3];
    cVar2 = ref[lVar3];
    if ((cVar1 == '\0') || (cVar2 == '\0')) break;
    if (cVar1 != cVar2) {
      return 0;
    }
    lVar3 = lVar3 + 1;
  }
  return (int)(cVar2 == cVar1);
}

Assistant:

int mmk_streq(const char *src, const char *ref)
{
    for (; *src && *ref; ++src, ++ref) {
        if (*src != *ref)
            return 0;
    }
    return *ref == *src;
}